

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quuid.cpp
# Opt level: O2

QUuid createFromName(QUuid ns,QByteArrayView baseData,Algorithm algorithm,int version)

{
  long lVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  QSpan<const_QByteArrayView,_18446744073709551615UL> data;
  QByteArrayView QVar3;
  QUuid QVar4;
  QSpan<std::byte,_18446744073709551615UL> buffer;
  Id128Bytes *local_88 [2];
  QByteArrayView local_78;
  qsizetype local_68;
  storage_type *local_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined4 local_48;
  QUuid ns_local;
  
  ns_local.data4 = ns.data4;
  ns_local._0_8_ = ns._0_8_;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = 0xaaaaaaaa;
  local_88[0] = QUuid::toBytes((Id128Bytes *)&ns_local,(QUuid *)0x0,(Endian)baseData.m_size);
  local_78.m_size = 0x10;
  data.super_QSpanBase<const_QByteArrayView,_18446744073709551615UL>.m_size = 2;
  data.super_QSpanBase<const_QByteArrayView,_18446744073709551615UL>.m_data = &local_78;
  buffer.super_QSpanBase<std::byte,_18446744073709551615UL>.m_size = 0x14;
  buffer.super_QSpanBase<std::byte,_18446744073709551615UL>.m_data = (byte *)&local_58;
  local_78.m_data = (storage_type *)local_88;
  local_68 = baseData.m_size;
  local_60 = baseData.m_data;
  QVar3 = QCryptographicHash::hashInto(buffer,data,algorithm);
  QVar3.m_size = (qsizetype)QVar3.m_data;
  QVar4 = QUuid::fromRfc4122((QUuid *)0x10,QVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    uVar2 = QVar4._0_8_ & 0xffffffffffff | (ulong)(version << 0xc | QVar4.data3 & 0xfff) << 0x30;
    QVar4.data4 = (uchar  [8])((ulong)QVar4.data4 & 0xffffffffffffff3f | 0x80);
    QVar4.data1 = (int)uVar2;
    QVar4.data2 = (short)(uVar2 >> 0x20);
    QVar4.data3 = (short)(uVar2 >> 0x30);
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

static QUuid createFromName(QUuid ns, QByteArrayView baseData, QCryptographicHash::Algorithm algorithm, int version) noexcept
{
    std::byte buffer[20];
    Q_ASSERT(sizeof buffer >= size_t(QCryptographicHash::hashLength(algorithm)));
    QByteArrayView hashResult
        = QCryptographicHash::hashInto(buffer, {QByteArrayView{ns.toBytes()}, baseData}, algorithm);
    Q_ASSERT(hashResult.size() >= 16);
    hashResult.truncate(16); // Sha1 will be too long

    QUuid result = QUuid::fromRfc4122(hashResult);

    result.data3 &= 0x0FFF;
    result.data3 |= (version << 12);
    result.data4[0] &= 0x3F;
    result.data4[0] |= 0x80;

    return result;
}